

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

void __thiscall
QConcatenateTablesProxyModelPrivate::slotColumnsInserted
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *parent,int start,int end)

{
  bool bVar1;
  QModelIndex *this_00;
  QConcatenateTablesProxyModelPrivate *in_RDI;
  QConcatenateTablesProxyModel *q;
  QConcatenateTablesProxyModelPrivate *this_01;
  
  this_01 = in_RDI;
  this_00 = (QModelIndex *)q_func(in_RDI);
  bVar1 = QModelIndex::isValid(this_00);
  if ((!bVar1) && (in_RDI->m_newColumnCount != in_RDI->m_columnCount)) {
    in_RDI->m_columnCount = in_RDI->m_newColumnCount;
    QAbstractItemModel::endInsertColumns((QAbstractItemModel *)this_01);
  }
  return;
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotColumnsInserted(const QModelIndex &parent, int start,
                                                              int end)
{
    Q_UNUSED(start);
    Q_UNUSED(end);
    Q_Q(QConcatenateTablesProxyModel);
    if (parent.isValid()) // flat model
        return;
    if (m_newColumnCount != m_columnCount) {
        m_columnCount = m_newColumnCount;
        q->endInsertColumns();
    }
}